

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_x509a.cc
# Opt level: O3

int X509_alias_set1(X509 *x,uchar *name,int len)

{
  ASN1_UTF8STRING *a;
  stack_st_GENERAL_NAME *psVar1;
  int iVar2;
  ASN1_VALUE *pAVar3;
  ASN1_STRING *str;
  
  if (name == (uchar *)0x0) {
    iVar2 = 1;
    if (((x != (X509 *)0x0) && (x->altname != (stack_st_GENERAL_NAME *)0x0)) &&
       (a = *(ASN1_UTF8STRING **)&(x->altname->stack).sorted, a != (ASN1_UTF8STRING *)0x0)) {
      ASN1_UTF8STRING_free(a);
      psVar1 = x->altname;
      (psVar1->stack).sorted = 0;
      (psVar1->stack).num_alloc = 0;
    }
  }
  else {
    iVar2 = 0;
    if (x != (X509 *)0x0) {
      pAVar3 = (ASN1_VALUE *)x->altname;
      if (pAVar3 == (ASN1_VALUE *)0x0) {
        pAVar3 = ASN1_item_new((ASN1_ITEM *)&X509_CERT_AUX_it);
        x->altname = (stack_st_GENERAL_NAME *)pAVar3;
        if (pAVar3 == (ASN1_VALUE *)0x0) {
          return 0;
        }
      }
      str = *(ASN1_STRING **)(pAVar3 + 0x10);
      if (str == (ASN1_STRING *)0x0) {
        str = ASN1_UTF8STRING_new();
        *(ASN1_STRING **)(pAVar3 + 0x10) = str;
        if (str == (ASN1_UTF8STRING *)0x0) {
          return 0;
        }
      }
      iVar2 = ASN1_STRING_set(str,name,len);
      return iVar2;
    }
  }
  return iVar2;
}

Assistant:

int X509_alias_set1(X509 *x, const uint8_t *name, ossl_ssize_t len) {
  X509_CERT_AUX *aux;
  // TODO(davidben): Empty aliases are not meaningful in PKCS#12, and the
  // getters cannot quite represent them. Also erase the object if |len| is
  // zero.
  if (!name) {
    if (!x || !x->aux || !x->aux->alias) {
      return 1;
    }
    ASN1_UTF8STRING_free(x->aux->alias);
    x->aux->alias = NULL;
    return 1;
  }
  if (!(aux = aux_get(x))) {
    return 0;
  }
  if (!aux->alias && !(aux->alias = ASN1_UTF8STRING_new())) {
    return 0;
  }
  return ASN1_STRING_set(aux->alias, name, len);
}